

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

borg_need borg_maintain_light(void)

{
  borg_item *pbVar1;
  _Bool _Var2;
  borg_need bVar3;
  wchar_t wVar4;
  borg_need bVar5;
  ulong uVar6;
  
  pbVar1 = borg_items;
  uVar6 = (ulong)z_info->pack_size;
  _Var2 = flag_has_dbg(borg_items[uVar6 + 5].flags,5,0x15,"current_light->flags","OF_NO_FUEL");
  bVar3 = BORG_NO_NEED;
  bVar5 = BORG_NO_NEED;
  if (!_Var2) {
    if (pbVar1[uVar6 + 5].tval == '\x13') {
      bVar5 = bVar3;
      if (sv_light_torch == (uint)pbVar1[uVar6 + 5].sval) {
        if (pbVar1[uVar6 + 5].timeout < 0xfb) {
          wVar4 = borg_slot(L'\x13',sv_light_torch);
          bVar5 = (uint)wVar4 >> 0x1e & ~BORG_MET_NEED;
        }
      }
      else if ((sv_light_lantern == (uint)pbVar1[uVar6 + 5].sval) &&
              (borg_items[(ulong)z_info->pack_size + 5].timeout < 1000)) {
        _Var2 = borg_refuel_lantern();
        bVar5 = BORG_UNMET_NEED - _Var2;
      }
    }
    else {
      wVar4 = borg_slot(L'\x13',sv_light_lantern);
      if (wVar4 < L'\0') {
        wVar4 = borg_slot(L'\x13',sv_light_torch);
      }
      if (wVar4 < L'\0') {
        bVar5 = BORG_UNMET_NEED;
      }
      else {
        borg_keypress(0x77);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar4]);
        bVar5 = BORG_MET_NEED;
      }
    }
  }
  return bVar5;
}

Assistant:

enum borg_need borg_maintain_light(void)
{
    int        i;
    borg_item* current_light = &borg_items[INVEN_LIGHT];

    if (of_has(current_light->flags, OF_NO_FUEL))
        return BORG_NO_NEED;

    /*  current torch */
    if (current_light->tval == TV_LIGHT) {
        if (current_light->sval == sv_light_torch) {
            if (current_light->timeout > 250) {
                return BORG_NO_NEED;
            } else {
                /* Look for another torch */
                i = borg_slot(TV_LIGHT, sv_light_torch);
                if (i < 0)
                    return BORG_UNMET_NEED;

                /* Torches automatically disappear when they get to 0 turns
                 * so we don't need to actively swap them out */
                return BORG_NO_NEED;
            }
        }

        /* Refuel current lantern */
        if (current_light->sval == sv_light_lantern) {
            /* Refuel the lantern if needed */
            if (borg_items[INVEN_LIGHT].timeout < 1000) {
                if (borg_refuel_lantern())
                    return BORG_MET_NEED;

                return BORG_UNMET_NEED;
            }
        }
        return BORG_NO_NEED;
    } else {
        i = borg_slot(TV_LIGHT, sv_light_lantern);
        if (i < 0) {
            i = borg_slot(TV_LIGHT, sv_light_torch);
        }

        if (i < 0) {
            return BORG_UNMET_NEED;
        } else {
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);
            return BORG_MET_NEED;
        }
    }
}